

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::create_binary_variable
          (Proof *this,int vertex,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x1a5b9c);
  __args_1 = &local_38;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>::
  operator()(in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  std::
  map<long,std::__cxx11::string,std::less<long>,std::allocator<std::pair<long_const,std::__cxx11::string>>>
  ::emplace<int&,std::__cxx11::string>
            (in_stack_ffffffffffffffa0,
             (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),__args_1);
  std::__cxx11::string::~string(__args_1);
  return;
}

Assistant:

auto Proof::create_binary_variable(int vertex,
    const function<auto(int)->string> & name) -> void
{
    _imp->binary_variable_mappings.emplace(vertex, name(vertex));
}